

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O2

XMLSize_t xercesc_4_0::XMLString::hashN(XMLCh *tohash,XMLSize_t n,XMLSize_t hashModulus)

{
  ulong uVar1;
  XMLSize_t XVar2;
  
  if (n == 0 || tohash == (XMLCh *)0x0) {
    return 0;
  }
  uVar1 = (ulong)(ushort)*tohash;
  for (XVar2 = 0; n != XVar2; XVar2 = XVar2 + 1) {
    uVar1 = (uVar1 >> 0x18) + uVar1 * 0x26 + (ulong)(ushort)tohash[XVar2 + 1];
  }
  return uVar1 % hashModulus;
}

Assistant:

inline XMLSize_t XMLString::hashN(const   XMLCh* const   tohash
                                  , const XMLSize_t       n
                                  , const XMLSize_t       hashModulus)
{
  if (tohash == 0 || n == 0)
    return 0;

  const XMLCh* curCh = tohash;
  XMLSize_t hashVal = (XMLSize_t)(*curCh++);

  for(XMLSize_t i=0;i<n;i++)
    hashVal = (hashVal * 38) + (hashVal >> 24) + (XMLSize_t)(*curCh++);

  // Divide by modulus
  return hashVal % hashModulus;
}